

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

bool __thiscall smf::MidiFile::readBase64(MidiFile *this,istream *instream)

{
  ssize_t sVar1;
  size_t __nbytes;
  void *__buf;
  MidiFile *this_00;
  string base64data;
  string local_1b0;
  stringstream stream;
  ostream local_180 [376];
  
  this_00 = *(MidiFile **)(instream + *(long *)(*(long *)instream + -0x18) + 0xe8);
  base64data._M_dataplus._M_p = (pointer)&base64data.field_2;
  __nbytes = 0;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&base64data);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  base64Decode(&local_1b0,this_00,&base64data);
  std::operator<<(local_180,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  sVar1 = read(this,(int)&stream,__buf,__nbytes);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::__cxx11::string::~string((string *)&base64data);
  return (bool)(char)sVar1;
}

Assistant:

bool MidiFile::readBase64(std::istream& instream) {
	std::string base64data((std::istreambuf_iterator<char>(instream)),
			std::istreambuf_iterator<char>());
	std::stringstream stream;
	stream << MidiFile::base64Decode(base64data);
	return MidiFile::read(stream);
}